

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_map_clear(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue obj;
  undefined1 auVar1 [16];
  JSMapRecord *pJVar2;
  JSMapState *s_00;
  undefined4 in_R9D;
  JSMapRecord *mr;
  list_head *el1;
  list_head *el;
  JSMapState *s;
  undefined8 in_stack_ffffffffffffffa8;
  JSMapRecord *pJVar3;
  JSContext *in_stack_ffffffffffffffb0;
  JSMapRecord *mr_00;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uStack_c;
  undefined8 local_8;
  
  obj.tag._0_4_ = in_stack_ffffffffffffffc0;
  obj.u = (JSValueUnion)in_stack_ffffffffffffffb8;
  obj.tag._4_4_ = in_R9D;
  s_00 = (JSMapState *)
         JS_GetOpaque2(in_stack_ffffffffffffffb0,obj,
                       (JSClassID)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  if (s_00 == (JSMapState *)0x0) {
    local_8 = 6;
  }
  else {
    mr_00 = (JSMapRecord *)(s_00->records).next;
    pJVar2 = (JSMapRecord *)mr_00->map;
    while (pJVar3 = pJVar2, mr_00 != (JSMapRecord *)&s_00->records) {
      map_delete_record((JSRuntime *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),s_00,mr_00);
      pJVar2 = (JSMapRecord *)((list_head *)&pJVar3->map)->prev;
      mr_00 = pJVar3;
    }
    local_8 = 3;
  }
  auVar1._4_8_ = local_8;
  auVar1._0_4_ = uStack_c;
  auVar1._12_4_ = 0;
  return (JSValue)(auVar1 << 0x20);
}

Assistant:

static JSValue js_map_clear(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    struct list_head *el, *el1;
    JSMapRecord *mr;

    if (!s)
        return JS_EXCEPTION;
    list_for_each_safe(el, el1, &s->records) {
        mr = list_entry(el, JSMapRecord, link);
        map_delete_record(ctx->rt, s, mr);
    }
    return JS_UNDEFINED;
}